

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::pid_formatter<spdlog::details::scoped_padder>::format
          (pid_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  uint value;
  long lVar2;
  scoped_padder p;
  scoped_padder local_60;
  format_int local_38;
  
  value = getpid();
  uVar1 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  scoped_padder::scoped_padder
            (&local_60,
             (ulong)((uint)*(ushort *)(fmt::v7::detail::bsr2log10(int)::data + (ulong)uVar1 * 2) -
                    (uint)(value < *(uint *)(fmt::v7::detail::basic_data<void>::
                                             zero_or_powers_of_10_32_new +
                                            (ulong)*(ushort *)
                                                    (fmt::v7::detail::bsr2log10(int)::data +
                                                    (ulong)uVar1 * 2) * 4))),
             &(this->super_flag_formatter).padinfo_,dest);
  local_38.str_ = fmt::v7::format_int::format_unsigned<unsigned_int>(&local_38,value);
  lVar2 = (long)&local_38 - (long)local_38.str_;
  if (-0x16 < lVar2) {
    fmt::v7::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_38.str_,local_38.str_ + lVar2 + 0x15);
    scoped_padder::~scoped_padder(&local_60);
    return;
  }
  fmt::v7::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/core.h"
             ,0x146,"negative value");
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = ScopedPadder::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }